

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * mp_nthroot(mp_int *y,uint n,mp_int *remainder_out)

{
  long lVar1;
  ulong *puVar2;
  mp_int *a;
  uint uVar3;
  uint which;
  long *ptr;
  mp_int *pmVar4;
  ulong uVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong factor1;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  ulong local_58;
  
  uVar12 = (ulong)n;
  uVar3 = n + 1;
  factor1 = (ulong)(n * 2 + 3);
  uVar7 = 0;
  ptr = (long *)safemalloc(factor1,8,0);
  do {
    pmVar4 = mp_make_sized(y->nw + 1);
    ptr[uVar7] = (long)pmVar4;
    uVar7 = uVar7 + 1;
  } while (factor1 != uVar7);
  uVar7 = (ulong)uVar3;
  pmVar4 = (mp_int *)ptr[n * 2 + 2];
  lVar13 = *(long *)*ptr;
  if (lVar13 != 0) {
    lVar1 = ((long *)*ptr)[1];
    uVar10 = 1;
    lVar6 = 0;
    do {
      *(undefined8 *)(lVar1 + lVar6 * 8) = uVar10;
      lVar6 = lVar6 + 1;
      uVar10 = 0;
    } while (lVar13 != lVar6);
  }
  local_58 = (y->nw << 6) / uVar12;
  do {
    if (uVar3 == 0) {
      mp_cmp_hs(y,(mp_int *)ptr[uVar7 + uVar12]);
    }
    else {
      uVar9 = 0;
      do {
        puVar2 = (ulong *)ptr[uVar7 + uVar9];
        uVar8 = *(ulong *)ptr[uVar9];
        if (*puVar2 < uVar8) {
          uVar8 = *puVar2;
        }
        memmove((void *)puVar2[1],(void *)((ulong *)ptr[uVar9])[1],uVar8 * 8);
        smemclr((void *)(uVar8 * 8 + puVar2[1]),(*puVar2 - uVar8) * 8);
        if (uVar9 != 0) {
          uVar5 = 1;
          uVar11 = 1;
          lVar13 = 0;
          uVar8 = uVar9;
          do {
            mp_mul_integer_into(pmVar4,(mp_int *)ptr[uVar11 - 1],(uint16_t)uVar5);
            mp_lshift_fixed_into(pmVar4,pmVar4,(uVar9 - lVar13) * local_58);
            a = (mp_int *)ptr[uVar7 + uVar9];
            mp_add_masked_into(a->w,a->nw,a,pmVar4,0xffffffffffffffff,0,0);
            uVar5 = (((uint)uVar5 & 0xffff) * (int)uVar8) / uVar11;
            if (0xffff < uVar5) {
              __assert_fail("binom_mul < 0x10000",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                            ,0x9ac,"mp_int *mp_nthroot(mp_int *, unsigned int, mp_int *)");
            }
            uVar11 = uVar11 + 1;
            lVar13 = lVar13 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar7);
      which = mp_cmp_hs(y,(mp_int *)ptr[uVar7 + uVar12]);
      if (uVar3 != 0) {
        uVar9 = 0;
        do {
          mp_select_into((mp_int *)ptr[uVar9],(mp_int *)ptr[uVar9],(mp_int *)ptr[uVar7 + uVar9],
                         which);
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
    }
    bVar14 = local_58 != 0;
    local_58 = local_58 - 1;
  } while (bVar14);
  if (remainder_out != (mp_int *)0x0) {
    mp_add_masked_into(remainder_out->w,remainder_out->nw,y,(mp_int *)ptr[uVar12],0xffffffffffffffff
                       ,0xffffffffffffffff,1);
  }
  uVar7 = 0;
  pmVar4 = mp_make_sized((y->nw << 6) / uVar12 + 0x3f >> 6);
  uVar12 = *(ulong *)ptr[1];
  if (pmVar4->nw < uVar12) {
    uVar12 = pmVar4->nw;
  }
  memmove(pmVar4->w,(void *)((ulong *)ptr[1])[1],uVar12 * 8);
  smemclr(pmVar4->w + uVar12,(pmVar4->nw - uVar12) * 8);
  do {
    mp_free((mp_int *)ptr[uVar7]);
    uVar7 = uVar7 + 1;
  } while (factor1 != uVar7);
  safefree(ptr);
  return pmVar4;
}

Assistant:

mp_int *mp_nthroot(mp_int *y, unsigned n, mp_int *remainder_out)
{
    /*
     * Allocate scratch space.
     */
    mp_int **alloc, **powers, **newpowers, *scratch;
    size_t nalloc = 2*(n+1)+1;
    alloc = snewn(nalloc, mp_int *);
    for (size_t i = 0; i < nalloc; i++)
        alloc[i] = mp_make_sized(y->nw + 1);
    powers = alloc;
    newpowers = alloc + (n+1);
    scratch = alloc[2*n+2];

    /*
     * We're computing the rounded-down nth root of y, i.e. the
     * maximal x such that x^n <= y. We try to add 2^i to it for each
     * possible value of i, starting from the largest one that might
     * fit (i.e. such that 2^{n*i} fits in the size of y) downwards to
     * i=0.
     *
     * We track all the smaller powers of x in the array 'powers'. In
     * each iteration, if we update x, we update all of those values
     * to match.
     */
    mp_copy_integer_into(powers[0], 1);
    for (size_t s = mp_max_bits(y) / n + 1; s-- > 0 ;) {
        /*
         * Let b = 2^s. We need to compute the powers (x+b)^i for each
         * i, starting from our recorded values of x^i.
         */
        for (size_t i = 0; i < n+1; i++) {
            /*
             * (x+b)^i = x^i
             *         + (i choose 1) x^{i-1} b
             *         + (i choose 2) x^{i-2} b^2
             *         + ...
             *         + b^i
             */
            uint16_t binom = 1;       /* coefficient of b^i */
            mp_copy_into(newpowers[i], powers[i]);
            for (size_t j = 0; j < i; j++) {
                /* newpowers[i] += binom * powers[j] * 2^{(i-j)*s} */
                mp_mul_integer_into(scratch, powers[j], binom);
                mp_lshift_fixed_into(scratch, scratch, (i-j) * s);
                mp_add_into(newpowers[i], newpowers[i], scratch);

                uint32_t binom_mul = binom;
                binom_mul *= (i-j);
                binom_mul /= (j+1);
                assert(binom_mul < 0x10000);
                binom = binom_mul;
            }
        }

        /*
         * Now, is the new value of x^n still <= y? If so, update.
         */
        unsigned newbit = mp_cmp_hs(y, newpowers[n]);
        for (size_t i = 0; i < n+1; i++)
            mp_select_into(powers[i], powers[i], newpowers[i], newbit);
    }

    if (remainder_out)
        mp_sub_into(remainder_out, y, powers[n]);

    mp_int *root = mp_new(mp_max_bits(y) / n);
    mp_copy_into(root, powers[1]);

    for (size_t i = 0; i < nalloc; i++)
        mp_free(alloc[i]);
    sfree(alloc);

    return root;
}